

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<QWindowSystemInterfacePrivate::WindowSystemEvent_*>::begin
          (QList<QWindowSystemInterfacePrivate::WindowSystemEvent_*> *this)

{
  WindowSystemEvent **n;
  QArrayDataPointer<QWindowSystemInterfacePrivate::WindowSystemEvent_*> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QWindowSystemInterfacePrivate::WindowSystemEvent_*> *)0x446819);
  QArrayDataPointer<QWindowSystemInterfacePrivate::WindowSystemEvent_*>::operator->(in_RDI);
  n = QArrayDataPointer<QWindowSystemInterfacePrivate::WindowSystemEvent_*>::begin
                ((QArrayDataPointer<QWindowSystemInterfacePrivate::WindowSystemEvent_*> *)0x44682a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }